

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O1

float ** directions(PGMData *gy,PGMData *gx)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  float **ppfVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  ppfVar4 = mem_alloc(gy->row,gy->col);
  iVar1 = gy->row;
  if (0 < (long)iVar1) {
    uVar2 = gy->col;
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        memset(ppfVar4[lVar6],0,(ulong)uVar2 << 2);
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  if (0 < gy->row) {
    lVar6 = 0;
    do {
      if (0 < gy->col) {
        pfVar3 = ppfVar4[lVar6];
        lVar5 = 0;
        do {
          fVar7 = atanf(gy->pixel_matrix[lVar6][lVar5] / gx->pixel_matrix[lVar6][lVar5]);
          pfVar3[lVar5] = fVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 < gy->col);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < gy->row);
  }
  return ppfVar4;
}

Assistant:

float **directions(PGMData *gy, PGMData *gx)
{
    float **dir_matrix = mem_alloc(gy->row, gy->col);
    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = 0;
        }
    }

    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = atanf(gy->pixel_matrix[i][j] / gx->pixel_matrix[i][j]);
        }
    }

    return dir_matrix;
}